

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  uint *puVar1;
  expression_lhs eVar2;
  expression_lhs eVar3;
  ostream *poVar4;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *extraout_RAX_01;
  result *extraout_RAX_02;
  result *prVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  ostringstream os;
  ulong *local_288;
  size_type local_280;
  ulong local_278;
  undefined8 uStack_270;
  string local_268;
  ulong *local_248;
  undefined8 local_240;
  ulong uStack_238;
  undefined8 uStack_230;
  ulong *local_228;
  size_type local_220;
  ulong uStack_218;
  undefined8 local_210;
  ulong *local_208;
  size_type local_200;
  ulong local_1f8;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  expression_lhs local_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined8 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  eVar2 = *this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  puVar1 = (uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[optional:",10);
  eVar3 = *this;
  if (eVar3 == (expression_lhs)0x1) {
    to_string<(anonymous_namespace)::Explicit>(&local_268,(Explicit *)(this + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p == &local_268.field_2) {
      uStack_270 = local_268.field_2._8_8_;
      local_268._M_dataplus._M_p = (pointer)&local_278;
    }
    local_280 = local_268._M_string_length;
    local_288 = (ulong *)local_268._M_dataplus._M_p;
  }
  else {
    local_1c0 = &local_1b0;
    local_1b0._M_allocated_capacity._1_2_ = 0x6d65;
    local_1b0._M_allocated_capacity._3_4_ = 0x5d797470;
    local_1b0._M_local_buf[7] = '\0';
    local_268.field_2._M_allocated_capacity = 0x5d7974706d655b;
    local_268.field_2._8_8_ = local_1b0._8_8_;
    local_1b8 = 0;
    local_1b0._M_local_buf[0] = '\0';
    local_288 = &local_278;
    uStack_270 = local_1b0._8_8_;
    local_280 = 7;
  }
  local_278 = local_268.field_2._M_allocated_capacity;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_allocated_capacity =
       local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_288,local_280);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if (eVar3 == (expression_lhs)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_1c0 != &local_1b0) {
      uVar6 = CONCAT17(local_1b0._M_local_buf[7],
                       CONCAT43(local_1b0._M_allocated_capacity._3_4_,
                                CONCAT21(local_1b0._M_allocated_capacity._1_2_,
                                         local_1b0._M_local_buf[0])));
      _Var7._M_p = (pointer)local_1c0;
      goto LAB_001f594c;
    }
  }
  else {
    uVar6 = local_268.field_2._M_allocated_capacity;
    _Var7._M_p = local_268._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_001f594c:
      operator_delete(_Var7._M_p,uVar6 + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  if (local_288 == &local_278) {
    local_210 = uStack_270;
    local_228 = &uStack_218;
  }
  else {
    local_228 = local_288;
  }
  uStack_218 = local_278;
  local_220 = local_280;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_228 == &uStack_218) {
    uStack_230 = local_210;
  }
  else if (local_228 != &uStack_238) {
    local_208 = local_228;
    goto LAB_001f5a36;
  }
  local_208 = &local_1f8;
  uStack_1f0 = (undefined4)uStack_230;
  uStack_1ec = uStack_230._4_4_;
LAB_001f5a36:
  local_1f8 = uStack_218;
  local_200 = local_220;
  local_240 = 0;
  uStack_238 = uStack_218 & 0xffffffffffffff00;
  local_248 = &uStack_238;
  local_1e8 = eVar2;
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_208,(long)local_208 + local_220);
  __return_storage_ptr__->passed = (bool)local_1e8;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_1e0,local_1d8 + (long)local_1e0)
  ;
  prVar5 = extraout_RAX;
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
    prVar5 = extraout_RAX_00;
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
    prVar5 = extraout_RAX_01;
  }
  if (local_248 != &uStack_238) {
    operator_delete(local_248,uStack_238 + 1);
    prVar5 = extraout_RAX_02;
  }
  return prVar5;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }